

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O1

uint32_t helper_atomic_cmpxchgl_be_x86_64
                   (CPUArchState *env,target_ulong addr,uint32_t cmpv,uint32_t newv,TCGMemOpIdx oi)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uintptr_t unaff_retaddr;
  
  puVar2 = (uint *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  uVar3 = cmpv >> 0x18 | (cmpv & 0xff0000) >> 8 | (cmpv & 0xff00) << 8 | cmpv << 0x18;
  LOCK();
  uVar1 = *puVar2;
  if (uVar3 == uVar1) {
    *puVar2 = newv >> 0x18 | (newv & 0xff0000) >> 8 | (newv & 0xff00) << 8 | newv << 0x18;
    uVar1 = uVar3;
  }
  UNLOCK();
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;
#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, BSWAP(cmpv), BSWAP(newv));
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, BSWAP(cmpv), BSWAP(newv));
#else
    ret = atomic_cmpxchg__nocheck(haddr, BSWAP(cmpv), BSWAP(newv));
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}